

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify-walker-impl.h
# Opt level: O1

void __thiscall
wasm::StringifyWalker<wasm::HashStringifyWalker>::dequeueControlFlow
          (StringifyWalker<wasm::HashStringifyWalker> *this)

{
  Id IVar1;
  Expression *pEVar2;
  uintptr_t uVar3;
  SeparatorReason SVar4;
  SeparatorReason SVar5;
  SeparatorReason SVar6;
  SeparatorReason SVar7;
  SeparatorReason SVar8;
  SeparatorReason SVar9;
  SeparatorReason SVar10;
  SeparatorReason SVar11;
  _Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
  in_RAX;
  undefined8 unaff_RBX;
  HashStringifyWalker *self;
  _Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
  _Var12;
  long lVar13;
  ulong uVar14;
  Try *tryy;
  undefined1 in_stack_00000008 [16];
  _Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
  _Var15;
  
  pEVar2 = *(this->controlFlowQueue).c.
            super__Deque_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  std::deque<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_front
            (&(this->controlFlowQueue).c);
  IVar1 = pEVar2->_id;
  if (IVar1 < LoopId) {
    if (IVar1 == BlockId) {
      SVar10.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      ._8_8_ = unaff_RBX;
      SVar10.reason.
      super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      .
      super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
      ._M_u = in_RAX;
      ::wasm::HashStringifyWalker::addUniqueSymbol(SVar10);
      uVar3 = pEVar2[2].type.id;
      if (uVar3 != 0) {
        lVar13 = 0;
        uVar14 = 0;
        do {
          if (pEVar2[2].type.id <= uVar14) goto LAB_001cf8eb;
          Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
          ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                  *)this,(Expression **)(*(long *)(pEVar2 + 2) + lVar13));
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 8;
        } while (uVar3 != uVar14);
      }
      goto LAB_001cf8ce;
    }
    if (IVar1 != IfId) goto LAB_001cf927;
    SVar8.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._8_8_ = unaff_RBX;
    SVar8.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._M_u = in_RAX;
    ::wasm::HashStringifyWalker::addUniqueSymbol(SVar8);
    Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
    ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
            *)this,(Expression **)&pEVar2[1].type);
    if (*(long *)(pEVar2 + 2) == 0) goto LAB_001cf8ce;
    SVar9.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._8_8_ = unaff_RBX;
    SVar9.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._M_u = in_RAX;
    ::wasm::HashStringifyWalker::addUniqueSymbol(SVar9);
  }
  else {
    if (IVar1 != LoopId) {
      if (IVar1 == TryId) {
        SVar4.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        ._8_8_ = unaff_RBX;
        SVar4.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        ._M_u = in_RAX;
        ::wasm::HashStringifyWalker::addUniqueSymbol(SVar4);
        Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
        ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                *)this,(Expression **)(pEVar2 + 2));
        SVar5.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        ._8_8_ = unaff_RBX;
        SVar5.reason.
        super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        .
        super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
        ._M_u = in_RAX;
        ::wasm::HashStringifyWalker::addUniqueSymbol(SVar5);
        _Var15 = *(_Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
                   *)(pEVar2 + 5);
        if (_Var15 != (_Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
                       )0x0) {
          lVar13 = 0;
          _Var12 = (_Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
                    )0x0;
          do {
            if ((ulong)*(_Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
                         *)(pEVar2 + 5) <= (ulong)_Var12) {
LAB_001cf8eb:
              __assert_fail("index < usedElements",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                            ,0xbc,
                            "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                           );
            }
            uVar3 = pEVar2[4].type.id;
            SVar6.reason.
            super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            ._8_8_ = unaff_RBX;
            SVar6.reason.
            super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            ._M_u = _Var15;
            ::wasm::HashStringifyWalker::addUniqueSymbol(SVar6);
            Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
            ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
                    *)this,(Expression **)(uVar3 + lVar13));
            SVar7.reason.
            super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            ._8_8_ = unaff_RBX;
            SVar7.reason.
            super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            .
            super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
            ._M_u = _Var15;
            ::wasm::HashStringifyWalker::addUniqueSymbol(SVar7);
            _Var12 = (_Variadic_union<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
                      )((long)_Var12 + 1);
            lVar13 = lVar13 + 8;
          } while (_Var15 != _Var12);
        }
        return;
      }
      if (IVar1 == TryTableId) {
        ::wasm::handle_unreachable
                  ("unexpected expression",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                   ,0x77);
      }
LAB_001cf927:
      __assert_fail("Properties::isControlFlowStructure(curr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/stringify-walker-impl.h"
                    ,0x76,
                    "void wasm::StringifyWalker<wasm::HashStringifyWalker>::dequeueControlFlow() [SubType = wasm::HashStringifyWalker]"
                   );
    }
    SVar11.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._8_8_ = unaff_RBX;
    SVar11.reason.
    super__Variant_base<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_assign_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Move_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Copy_ctor_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    .
    super__Variant_storage_alias<wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::FuncStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::BlockStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::IfStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::ElseStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::LoopStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryBodyStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::TryCatchStart,_wasm::StringifyWalker<wasm::HashStringifyWalker>::SeparatorReason::End>
    ._M_u = in_RAX;
    ::wasm::HashStringifyWalker::addUniqueSymbol(SVar11);
  }
  Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
  ::walk((Walker<wasm::HashStringifyWalker,_wasm::UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>_>
          *)this,(Expression **)(pEVar2 + 2));
LAB_001cf8ce:
  ::wasm::HashStringifyWalker::addUniqueSymbol((SeparatorReason)in_stack_00000008);
  return;
}

Assistant:

void StringifyWalker<SubType>::dequeueControlFlow() {
  auto& queue = controlFlowQueue;
  Expression* curr = queue.front();
  queue.pop();
  DBG(std::cerr << "controlFlowQueue.pop: " << ShallowExpression{curr} << ", "
                << curr << "\n");

  // TODO: Issue #5796, Make a ControlChildIterator
  switch (curr->_id) {
    case Expression::Id::BlockId: {
      auto* block = curr->cast<Block>();
      addUniqueSymbol(SeparatorReason::makeBlockStart(block));
      for (auto& child : block->list) {
        Super::walk(child);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::IfId: {
      auto* iff = curr->cast<If>();
      addUniqueSymbol(SeparatorReason::makeIfStart(iff));
      Super::walk(iff->ifTrue);
      if (iff->ifFalse) {
        addUniqueSymbol(SeparatorReason::makeElseStart());
        Super::walk(iff->ifFalse);
      }
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    case Expression::Id::TryId: {
      auto* tryy = curr->cast<Try>();
      addUniqueSymbol(SeparatorReason::makeTryBodyStart());
      Super::walk(tryy->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      for (auto& child : tryy->catchBodies) {
        addUniqueSymbol(SeparatorReason::makeTryCatchStart());
        Super::walk(child);
        addUniqueSymbol(SeparatorReason::makeEnd());
      }
      break;
    }
    case Expression::Id::LoopId: {
      auto* loop = curr->cast<Loop>();
      addUniqueSymbol(SeparatorReason::makeLoopStart(loop));
      Super::walk(loop->body);
      addUniqueSymbol(SeparatorReason::makeEnd());
      break;
    }
    default: {
      assert(Properties::isControlFlowStructure(curr));
      WASM_UNREACHABLE("unexpected expression");
    }
  }
}